

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filon.cpp
# Opt level: O2

double filon_fun_cos(int n,_func_double_ptr_int_double_ptr *f,double a,double b,double t)

{
  double *pdVar1;
  ulong uVar2;
  double *pdVar3;
  ostream *poVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_90;
  double local_80;
  double local_70;
  double local_68;
  double local_48;
  
  if ((a == b) && (!NAN(a) && !NAN(b))) {
    return 0.0;
  }
  if (n < 2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FILON_FUN_COS - Fatal error!\n");
    pcVar6 = "  N < 2\n";
  }
  else {
    if ((n & 1U) != 0) {
      pdVar1 = (double *)operator_new__((ulong)(uint)n * 8);
      uVar7 = n - 1;
      uVar5 = uVar7;
      for (uVar2 = 0; uVar2 != (uint)n; uVar2 = uVar2 + 1) {
        pdVar1[uVar2] = ((double)(int)uVar5 * a + (double)(int)uVar2 * b) / (double)(int)uVar7;
        uVar5 = uVar5 - 1;
      }
      dVar16 = (b - a) / (double)(int)uVar7;
      dVar10 = dVar16 * t;
      dVar11 = sin(dVar10);
      dVar12 = cos(dVar10);
      if (ABS(dVar10) * 6.0 <= 1.0) {
        dVar11 = pow(dVar10,3.0);
        dVar12 = pow(dVar10,5.0);
        dVar13 = pow(dVar10,7.0);
        local_90 = (dVar13 + dVar13) / 4725.0 +
                   (dVar12 + dVar12) / -315.0 + (dVar11 + dVar11) / 45.0;
        dVar14 = (dVar10 * dVar10 + dVar10 * dVar10) / 15.0;
        dVar11 = pow(dVar10,4.0);
        dVar12 = pow(dVar10,6.0);
        dVar13 = pow(dVar10,8.0);
        local_80 = (dVar13 * 4.0) / -22275.0 +
                   (dVar12 + dVar12) / 567.0 + (dVar11 * 4.0) / -105.0 + dVar14 + 0.6666666666666666
        ;
        dVar11 = pow(dVar10,4.0);
        dVar10 = pow(dVar10,6.0);
        local_70 = dVar10 / -11340.0 + dVar11 / 210.0 + (1.3333333333333333 - dVar14);
      }
      else {
        local_90 = pow(dVar10,3.0);
        local_90 = (dVar11 * -2.0 * dVar11 + dVar10 * dVar11 * dVar12 + dVar10 * dVar10) / local_90;
        local_80 = pow(dVar10,3.0);
        local_80 = (dVar11 * -4.0 * dVar12 + (dVar10 + dVar10) * dVar12 * dVar12 + dVar10 + dVar10)
                   / local_80;
        local_70 = pow(dVar10,3.0);
        local_70 = ((dVar11 - dVar12 * dVar10) * 4.0) / local_70;
      }
      pdVar3 = (*f)(n,pdVar1);
      dVar10 = *pdVar3;
      local_48 = cos(*pdVar1 * t);
      local_48 = local_48 * dVar10 * 0.5;
      uVar8 = (ulong)uVar7;
      for (uVar2 = 2; uVar2 < uVar8; uVar2 = uVar2 + 2) {
        dVar10 = pdVar3[uVar2];
        dVar11 = cos(pdVar1[uVar2] * t);
        local_48 = local_48 + dVar11 * dVar10;
      }
      dVar10 = pdVar3[uVar8];
      dVar11 = cos(pdVar1[uVar8] * t);
      local_68 = 0.0;
      for (lVar9 = 1; lVar9 <= n + -2; lVar9 = lVar9 + 2) {
        dVar12 = pdVar3[lVar9];
        dVar13 = cos(pdVar1[lVar9] * t);
        local_68 = local_68 + dVar13 * dVar12;
      }
      dVar12 = pdVar3[uVar8];
      dVar14 = sin(pdVar1[uVar8] * t);
      dVar13 = *pdVar3;
      dVar15 = sin(t * *pdVar1);
      operator_delete__(pdVar3);
      operator_delete__(pdVar1);
      return dVar16 * (local_70 * local_68 +
                      local_90 * (dVar14 * dVar12 - dVar15 * dVar13) +
                      local_80 * (dVar10 * 0.5 * dVar11 + local_48));
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FILON_FUN_COS - Fatal error!\n");
    pcVar6 = "  N must be odd.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar6);
  poVar4 = std::operator<<((ostream *)&std::cerr,"  N = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,n);
  std::operator<<(poVar4,"\n");
  exit(1);
}

Assistant:

double filon_fun_cos ( int n, double *f ( int n, double x[] ), double a, 
  double b, double t )

//****************************************************************************80
//
//  Purpose:
//
//    FILON_FUN_COS uses Filon's method on integrals with a cosine factor.
//
//  Discussion:
//
//    The integral to be approximated has the form:
//
//      Integral ( A <= X <= B ) F(X) * COS(T*X) dX
//
//    where T is user specified.
//
//    The function is interpolated over each subinterval by
//    a parabolic arc.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Chase, Lloyd Fosdick,
//    An Algorithm for Filon Quadrature,
//    Communications of the Association for Computing Machinery,
//    Volume 12, Number 8, August 1969, pages 453-457.
//
//    Stephen Chase, Lloyd Fosdick,
//    Algorithm 353:
//    Filon Quadrature,
//    Communications of the Association for Computing Machinery,
//    Volume 12, Number 8, August 1969, pages 457-458.
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//  Parameters:
//
//    Input, int N, the number of data points.
//    N must be odd, and greater than 1.
//
//    Input, double *F ( int n, double x[] ), the function which evaluates the 
//    integrand.
//
//    Input, double A, B, the limits of integration.
//
//    Input, double T, the multiplier of the X argument of the cosine.
//
//    Output, double FILON_FUN_COS, the approximate value of the integral.
//
{
  double alpha;
  double beta;
  double c2n;
  double c2nm1;
  double cost;
  double *ftab;
  double gamma;
  double h;
  int i;
  double sint;
  double theta;
  double value;
  double *x;

  if ( a == b )
  {
    value = 0.0;
    return value;
  }
 
  if ( n <= 1 )
  {
    cerr << "\n";
    cerr << "FILON_FUN_COS - Fatal error!\n";
    cerr << "  N < 2\n";
    cerr << "  N = " << n << "\n";
    exit ( 1 );
  }
 
  if ( ( n % 2 ) != 1 )
  {
    cerr << "\n";
    cerr << "FILON_FUN_COS - Fatal error!\n";
    cerr << "  N must be odd.\n";
    cerr << "  N = " << n << "\n";
    exit ( 1 );
  }
//
//  Set the X values.
//
  x = new double[n];
  for ( i = 0; i < n; i++ )
  {
    x[i] = ( static_cast<double> ( n - i - 1 ) * a   
           + static_cast<double> (     i     ) * b ) 
           / static_cast<double> ( n     - 1 );
  }

  h = ( b - a ) / static_cast<double> ( n - 1 );
  theta = t * h;
  sint = sin ( theta );
  cost = cos ( theta );

  if ( 6.0 * fabs ( theta ) <= 1.0 )
  {
    alpha = 2.0 * pow ( theta, 3 ) /   45.0 
          - 2.0 * pow ( theta, 5 ) /  315.0 
          + 2.0 * pow ( theta, 7 ) / 4725.0;
  
    beta =  2.0                    /     3.0 
          + 2.0 * pow ( theta, 2 ) /    15.0 
          - 4.0 * pow ( theta, 4 ) /   105.0 
          + 2.0 * pow ( theta, 6 ) /   567.0 
          - 4.0 * pow ( theta, 8 ) / 22275.0;

    gamma = 4.0                    /      3.0 
          - 2.0 * pow ( theta, 2 ) /     15.0 
          +       pow ( theta, 4 ) /    210.0 
          -       pow ( theta, 6 ) /  11340.0;
  }
  else
  {
    alpha = ( pow ( theta, 2 ) + theta * sint * cost - 2.0 * sint * sint ) 
      / pow ( theta, 3 );

    beta = ( 2.0 * theta + 2.0 * theta * cost * cost
      - 4.0 * sint * cost ) / pow ( theta, 3 );

    gamma = 4.0 * ( sint - theta * cost ) / pow ( theta, 3 );
  }
//
//  Tabulate the function.
//
  ftab = f ( n, x );

  c2n = 0.5 * ftab[0] * cos ( t * x[0] );
  for ( i = 2; i < n - 1; i = i + 2 )
  {
    c2n = c2n + ftab[i] * cos ( t * x[i] );
  }
  c2n = c2n + 0.5 * ftab[n-1] * cos ( t * x[n-1] );

  c2nm1 = 0.0;
  for ( i = 1; i <= n - 2; i = i + 2 )
  {
    c2nm1 = c2nm1 + ftab[i] * cos ( t * x[i] );
  }

  value = h * ( 
      alpha * ( ftab[n-1] * sin ( t * x[n-1] )  
              - ftab[0]   * sin ( t * x[0] ) ) 
    + beta * c2n 
    + gamma * c2nm1 );

  delete [] ftab;
  delete [] x;

  return value;
}